

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::
     seq_<jsonip::parser::or_<jsonip::parser::char_<(char)101>,jsonip::parser::char_<(char)69>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::parser::opt_<jsonip::parser::or_<jsonip::parser::char_<(char)45>,jsonip::parser::char_<(char)43>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  Reader *pRVar2;
  byte *pbVar3;
  bool bVar4;
  PositionType p;
  char *pcVar5;
  byte *pbVar6;
  pointer pSVar7;
  iterator iVar8;
  char *pcVar9;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar8._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar8,(State *)auStack_20);
    iVar8._M_current =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar8._M_current)->pos_ = (PositionType)auStack_20;
    (iVar8._M_current)->line_ = (size_t)cur_state.pos_;
    iVar8._M_current =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
  }
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  if (iVar8._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar8,(State *)auStack_20);
  }
  else {
    (iVar8._M_current)->pos_ = (PositionType)auStack_20;
    (iVar8._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pRVar2 = state->reader_;
  pbVar3 = (byte *)pRVar2->pos_;
  if (((long)pbVar3 - (long)pRVar2->buf_ == pRVar2->len_) || ((*pbVar3 | 0x20) != 0x65)) {
    pbVar6 = (byte *)state->max_pos_;
    if (state->max_pos_ < pbVar3) {
      state->max_pos_ = (PositionType)pbVar3;
      pbVar6 = pbVar3;
    }
    pbVar3 = (byte *)(state->stack_).
                     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pRVar2->pos_ = (PositionType)pbVar3;
    pSVar7 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
    if (pbVar6 < pbVar3) {
      state->max_pos_ = (PositionType)pbVar3;
    }
    pRVar2->pos_ = pSVar7[-2].pos_;
    pSVar7 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state->line_ = pSVar7[-1].line_;
    bVar4 = false;
  }
  else {
    auStack_20 = (undefined1  [8])(pbVar3 + 1);
    pRVar2->pos_ = (PositionType)auStack_20;
    if (state->max_pos_ < (ulong)auStack_20) {
      state->max_pos_ = (PositionType)auStack_20;
    }
    pSVar7 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar8._M_current = pSVar7 + -1;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
    cur_state.pos_ = (PositionType)state->line_;
    if (iVar8._M_current ==
        (state->stack_).
        super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
      ::
      _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                  *)&state->stack_,iVar8,(State *)auStack_20);
    }
    else {
      (iVar8._M_current)->pos_ = (PositionType)auStack_20;
      pSVar7[-1].line_ = (size_t)cur_state.pos_;
      ppSVar1 = &(state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    pRVar2 = state->reader_;
    pcVar5 = pRVar2->pos_;
    if (((long)pcVar5 - (long)pRVar2->buf_ == pRVar2->len_) ||
       ((*pcVar5 != '-' && (*pcVar5 != '+')))) {
      pcVar9 = state->max_pos_;
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
        pcVar9 = pcVar5;
      }
      pcVar5 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
      pRVar2->pos_ = pcVar5;
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      state->line_ = pSVar7[-1].line_;
    }
    else {
      pcVar5 = pcVar5 + 1;
      pRVar2->pos_ = pcVar5;
      pcVar9 = state->max_pos_;
      if (state->max_pos_ < pcVar5) {
        state->max_pos_ = pcVar5;
        pcVar9 = pcVar5;
      }
      pSVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    pSVar7 = pSVar7 + -1;
    bVar4 = true;
    if (pcVar9 < pcVar5) {
      state->max_pos_ = pcVar5;
    }
  }
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
  return bVar4;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }